

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

int secp256k1_musig_pubkey_agg
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *agg_pk,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_pubkey **pubkeys,size_t n_pubkeys
              )

{
  int iVar1;
  uchar *p1;
  size_t sVar2;
  long lVar3;
  secp256k1_ge *psVar4;
  undefined8 *puVar5;
  secp256k1_keyagg_cache_internal *psVar6;
  undefined8 *puVar7;
  byte bVar8;
  size_t ser_len;
  secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
  secp256k1_ge pk;
  secp256k1_gej pkj;
  secp256k1_ge local_298;
  secp256k1_context *local_240;
  uchar local_238 [8];
  uchar auStack_230 [8];
  uchar local_228 [8];
  uchar auStack_220 [8];
  secp256k1_pubkey **local_218;
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined4 local_1c0;
  undefined1 local_1b8 [224];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  secp256k1_gej local_b8;
  
  bVar8 = 0;
  if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
    agg_pk->data[0x30] = '\0';
    agg_pk->data[0x31] = '\0';
    agg_pk->data[0x32] = '\0';
    agg_pk->data[0x33] = '\0';
    agg_pk->data[0x34] = '\0';
    agg_pk->data[0x35] = '\0';
    agg_pk->data[0x36] = '\0';
    agg_pk->data[0x37] = '\0';
    agg_pk->data[0x38] = '\0';
    agg_pk->data[0x39] = '\0';
    agg_pk->data[0x3a] = '\0';
    agg_pk->data[0x3b] = '\0';
    agg_pk->data[0x3c] = '\0';
    agg_pk->data[0x3d] = '\0';
    agg_pk->data[0x3e] = '\0';
    agg_pk->data[0x3f] = '\0';
    agg_pk->data[0x20] = '\0';
    agg_pk->data[0x21] = '\0';
    agg_pk->data[0x22] = '\0';
    agg_pk->data[0x23] = '\0';
    agg_pk->data[0x24] = '\0';
    agg_pk->data[0x25] = '\0';
    agg_pk->data[0x26] = '\0';
    agg_pk->data[0x27] = '\0';
    agg_pk->data[0x28] = '\0';
    agg_pk->data[0x29] = '\0';
    agg_pk->data[0x2a] = '\0';
    agg_pk->data[0x2b] = '\0';
    agg_pk->data[0x2c] = '\0';
    agg_pk->data[0x2d] = '\0';
    agg_pk->data[0x2e] = '\0';
    agg_pk->data[0x2f] = '\0';
    agg_pk->data[0x10] = '\0';
    agg_pk->data[0x11] = '\0';
    agg_pk->data[0x12] = '\0';
    agg_pk->data[0x13] = '\0';
    agg_pk->data[0x14] = '\0';
    agg_pk->data[0x15] = '\0';
    agg_pk->data[0x16] = '\0';
    agg_pk->data[0x17] = '\0';
    agg_pk->data[0x18] = '\0';
    agg_pk->data[0x19] = '\0';
    agg_pk->data[0x1a] = '\0';
    agg_pk->data[0x1b] = '\0';
    agg_pk->data[0x1c] = '\0';
    agg_pk->data[0x1d] = '\0';
    agg_pk->data[0x1e] = '\0';
    agg_pk->data[0x1f] = '\0';
    agg_pk->data[0] = '\0';
    agg_pk->data[1] = '\0';
    agg_pk->data[2] = '\0';
    agg_pk->data[3] = '\0';
    agg_pk->data[4] = '\0';
    agg_pk->data[5] = '\0';
    agg_pk->data[6] = '\0';
    agg_pk->data[7] = '\0';
    agg_pk->data[8] = '\0';
    agg_pk->data[9] = '\0';
    agg_pk->data[10] = '\0';
    agg_pk->data[0xb] = '\0';
    agg_pk->data[0xc] = '\0';
    agg_pk->data[0xd] = '\0';
    agg_pk->data[0xe] = '\0';
    agg_pk->data[0xf] = '\0';
  }
  if (pubkeys == (secp256k1_pubkey **)0x0) {
    secp256k1_musig_pubkey_agg_cold_2();
  }
  else if (n_pubkeys == 0) {
    secp256k1_musig_pubkey_agg_cold_1();
  }
  else {
    local_1c0 = 1;
    local_210 = (undefined1  [16])0x0;
    local_200 = (undefined1  [16])0x0;
    local_1f0 = (undefined1  [16])0x0;
    local_1e0 = (undefined1  [16])0x0;
    local_1d0 = (undefined1  [16])0x0;
    local_240 = ctx;
    local_218 = pubkeys;
    if (n_pubkeys != 1) {
      sVar2 = 1;
LAB_00124b15:
      lVar3 = 0;
LAB_00124b1c:
      if ((*pubkeys)->data[lVar3] == pubkeys[sVar2]->data[lVar3]) goto code_r0x00124b26;
      iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)local_1b8,pubkeys[sVar2]);
      if (iVar1 == 0) {
        return 0;
      }
      puVar5 = (undefined8 *)local_1b8;
      puVar7 = (undefined8 *)local_210;
      for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar7 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
    }
LAB_00124b66:
    local_1b8._0_8_ = 0xc8fff302b399d5e0;
    local_1b8._8_8_ = 0x7c5b7f16badac71;
    local_1b8._16_8_ = 0x2a72ecf89701e2ef;
    local_1b8._24_8_ = 0xab148a38201a4c7b;
    local_1b8._96_8_ = 0x40;
    sVar2 = 0;
    while( true ) {
      local_298.x.n[0] = 0x21;
      iVar1 = secp256k1_ec_pubkey_serialize
                        (ctx,(uchar *)&local_b8,(size_t *)&local_298,pubkeys[sVar2],0x102);
      if (iVar1 == 0) break;
      secp256k1_sha256_write((secp256k1_sha256 *)local_1b8,(uchar *)&local_b8,0x21);
      sVar2 = sVar2 + 1;
      if (n_pubkeys == sVar2) {
        secp256k1_sha256_finalize((secp256k1_sha256 *)local_1b8,local_238);
        iVar1 = secp256k1_ecmult_multi_var
                          (&ctx->error_callback,(secp256k1_scratch *)0x0,&local_b8,
                           (secp256k1_scalar *)0x0,secp256k1_musig_pubkey_agg_callback,&local_240,
                           n_pubkeys);
        if (iVar1 == 0) {
          return 0;
        }
        secp256k1_ge_set_gej(&local_298,&local_b8);
        secp256k1_fe_impl_normalize_var(&local_298.y);
        if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
          psVar4 = &local_298;
          psVar6 = (secp256k1_keyagg_cache_internal *)local_1b8;
          for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
            (psVar6->pk).x.n[0] = (psVar4->x).n[0];
            psVar4 = (secp256k1_ge *)((long)psVar4 + ((ulong)bVar8 * -2 + 1) * 8);
            psVar6 = (secp256k1_keyagg_cache_internal *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
          }
          puVar5 = (undefined8 *)local_210;
          puVar7 = (undefined8 *)(local_1b8 + 0x58);
          for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar7 = *puVar5;
            puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          local_d8 = (undefined1  [16])0x0;
          local_1b8._208_16_ = (undefined1  [16])0x0;
          local_c8._0_4_ = 0;
          local_c8._4_4_ = 0;
          local_1b8[0xb0] = local_238[0];
          local_1b8[0xb1] = local_238[1];
          local_1b8[0xb2] = local_238[2];
          local_1b8[0xb3] = local_238[3];
          local_1b8[0xb4] = local_238[4];
          local_1b8[0xb5] = local_238[5];
          local_1b8[0xb6] = local_238[6];
          local_1b8[0xb7] = local_238[7];
          local_1b8[0xb8] = auStack_230[0];
          local_1b8[0xb9] = auStack_230[1];
          local_1b8[0xba] = auStack_230[2];
          local_1b8[0xbb] = auStack_230[3];
          local_1b8[0xbc] = auStack_230[4];
          local_1b8[0xbd] = auStack_230[5];
          local_1b8[0xbe] = auStack_230[6];
          local_1b8[0xbf] = auStack_230[7];
          local_1b8[0xc0] = local_228[0];
          local_1b8[0xc1] = local_228[1];
          local_1b8[0xc2] = local_228[2];
          local_1b8[0xc3] = local_228[3];
          local_1b8[0xc4] = local_228[4];
          local_1b8[0xc5] = local_228[5];
          local_1b8[0xc6] = local_228[6];
          local_1b8[199] = local_228[7];
          local_1b8[200] = auStack_220[0];
          local_1b8[0xc9] = auStack_220[1];
          local_1b8[0xca] = auStack_220[2];
          local_1b8[0xcb] = auStack_220[3];
          local_1b8[0xcc] = auStack_220[4];
          local_1b8[0xcd] = auStack_220[5];
          local_1b8[0xce] = auStack_220[6];
          local_1b8[0xcf] = auStack_220[7];
          secp256k1_keyagg_cache_save(keyagg_cache,(secp256k1_keyagg_cache_internal *)local_1b8);
        }
        if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
          if ((local_298.y.n[0] & 1) != 0) {
            local_298.y.n[0] = 0x3ffffbfffff0bc - local_298.y.n[0];
            local_298.y.n[1] = 0x3ffffffffffffc - local_298.y.n[1];
            local_298.y.n[2] = 0x3ffffffffffffc - local_298.y.n[2];
            local_298.y.n[3] = 0x3ffffffffffffc - local_298.y.n[3];
            local_298.y.n[4] = 0x3fffffffffffc - local_298.y.n[4];
          }
          secp256k1_ge_to_storage((secp256k1_ge_storage *)local_1b8,&local_298);
          *(undefined8 *)(agg_pk->data + 0x30) = local_1b8._48_8_;
          *(undefined8 *)(agg_pk->data + 0x38) = local_1b8._56_8_;
          *(undefined8 *)(agg_pk->data + 0x20) = local_1b8._32_8_;
          *(undefined8 *)(agg_pk->data + 0x28) = local_1b8._40_8_;
          *(undefined8 *)(agg_pk->data + 0x10) = local_1b8._16_8_;
          *(undefined8 *)(agg_pk->data + 0x18) = local_1b8._24_8_;
          *(undefined8 *)agg_pk->data = local_1b8._0_8_;
          *(undefined8 *)(agg_pk->data + 8) = local_1b8._8_8_;
          return 1;
        }
        return 1;
      }
    }
  }
  return 0;
code_r0x00124b26:
  lVar3 = lVar3 + 1;
  if (lVar3 == 0x40) goto code_r0x00124b2f;
  goto LAB_00124b1c;
code_r0x00124b2f:
  sVar2 = sVar2 + 1;
  if (sVar2 == n_pubkeys) goto LAB_00124b66;
  goto LAB_00124b15;
}

Assistant:

int secp256k1_musig_pubkey_agg(const secp256k1_context* ctx, secp256k1_xonly_pubkey *agg_pk, secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_pubkey * const* pubkeys, size_t n_pubkeys) {
    secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
    secp256k1_gej pkj;
    secp256k1_ge pkp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    if (agg_pk != NULL) {
        memset(agg_pk, 0, sizeof(*agg_pk));
    }
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(n_pubkeys > 0);

    ecmult_data.ctx = ctx;
    ecmult_data.pks = pubkeys;

    secp256k1_ge_set_infinity(&ecmult_data.second_pk);
    for (i = 1; i < n_pubkeys; i++) {
        if (secp256k1_memcmp_var(pubkeys[0], pubkeys[i], sizeof(*pubkeys[0])) != 0) {
            secp256k1_ge pk;
            if (!secp256k1_pubkey_load(ctx, &pk, pubkeys[i])) {
                return 0;
            }
            ecmult_data.second_pk = pk;
            break;
        }
    }

    if (!secp256k1_musig_compute_pks_hash(ctx, ecmult_data.pks_hash, pubkeys, n_pubkeys)) {
        return 0;
    }
    /* TODO: actually use optimized ecmult_multi algorithms by providing a
     * scratch space */
    if (!secp256k1_ecmult_multi_var(&ctx->error_callback, NULL, &pkj, NULL, secp256k1_musig_pubkey_agg_callback, (void *) &ecmult_data, n_pubkeys)) {
        /* In order to reach this line with the current implementation of
         * ecmult_multi_var one would need to provide a callback that can
         * fail. */
        return 0;
    }
    secp256k1_ge_set_gej(&pkp, &pkj);
    secp256k1_fe_normalize_var(&pkp.y);
    /* The resulting public key is infinity with negligible probability */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&pkp));
    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i = { 0 };
        cache_i.pk = pkp;
        cache_i.second_pk = ecmult_data.second_pk;
        memcpy(cache_i.pks_hash, ecmult_data.pks_hash, sizeof(cache_i.pks_hash));
        secp256k1_keyagg_cache_save(keyagg_cache, &cache_i);
    }

    if (agg_pk != NULL) {
        secp256k1_extrakeys_ge_even_y(&pkp);
        secp256k1_xonly_pubkey_save(agg_pk, &pkp);
    }
    return 1;
}